

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  Index dstCols;
  ostream *poVar1;
  Index dstRows;
  int iVar2;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  P;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  Q;
  Matrix3d rRes_eig;
  Matrix3d rRes_FA3Ri;
  Matrix3d rRes_FA3Rd;
  Vector3d tRes_eig;
  Vector3d tRes_FA3Ri;
  Vector3d tRes_FA3Rd;
  random_device rd;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_1518;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_14f8;
  Matrix3d local_14d8;
  Matrix3d local_1490;
  Matrix3d local_1448;
  Vector3d local_1400;
  Vector3d local_13e8;
  Vector3d local_13d0;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  local_1518.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_1518.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1518.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_14f8.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_14f8.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_14f8.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  iVar2 = 1000;
  while( true ) {
    randomMatrix((MatrixXd *)&local_1448,3,1,&local_13b8);
    randomMatrix((MatrixXd *)&local_1490,3,1,&local_13b8);
    if (local_1448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] != 4.94065645841247e-324 &&
        local_1448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] != 4.94065645841247e-324) break;
    if ((((long)local_1448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2] *
          (long)local_1448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] != 3) ||
        (local_1448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] != 1.48219693752374e-323)) ||
       (local_1448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] != 4.94065645841247e-324)) {
LAB_00114565:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 1>]"
                   );
    }
    local_14d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = *(double *)
           local_1448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
    local_14d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [1] = *(double *)
           ((long)local_1448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0] + 8);
    local_14d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [2] = *(double *)
           ((long)local_1448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0] + 0x10);
    if (local_1518.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_1518.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      _M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&local_1518,
                 (iterator)
                 local_1518.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (Matrix<double,_3,_1,_0,_3,_1> *)&local_14d8);
    }
    else {
      ((local_1518.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
           local_14d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      ((local_1518.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
           local_14d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      ((local_1518.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
           local_14d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
      local_1518.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_1518.
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if (local_1490.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] != 4.94065645841247e-324 &&
        local_1490.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] != 4.94065645841247e-324) break;
    if ((((long)local_1490.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2] *
          (long)local_1490.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] != 3) ||
        (local_1490.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] != 1.48219693752374e-323)) ||
       (local_1490.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] != 4.94065645841247e-324)) goto LAB_00114565;
    local_14d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = *(double *)
           local_1490.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
    local_14d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [1] = *(double *)
           ((long)local_1490.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0] + 8);
    local_14d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [2] = *(double *)
           ((long)local_1490.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0] + 0x10);
    if (local_14f8.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_14f8.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      _M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&local_14f8,
                 (iterator)
                 local_14f8.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (Matrix<double,_3,_1,_0,_3,_1> *)&local_14d8);
    }
    else {
      ((local_14f8.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
           local_14d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      ((local_14f8.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
           local_14d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      ((local_14f8.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
           local_14d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
      local_14f8.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_14f8.
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    free((void *)local_1490.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0]);
    free((void *)local_1448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0]);
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      FA3R_double(&local_1518,&local_14f8,(Matrix3d *)0x0,0x14,&local_1448,&local_13d0);
      FA3R_int(&local_1518,&local_14f8,(Matrix3d *)0x0,0x14,&local_1490,&local_13e8);
      eig3D_eig(&local_1518,&local_14f8,(Matrix3d *)0x0,&local_14d8,&local_1400);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FA3R double:",0xc);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"R: ",3);
      poVar1 = Eigen::operator<<((ostream *)&std::cout,
                                 (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_1448);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"t: ",3);
      poVar1 = Eigen::operator<<((ostream *)&std::cout,
                                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_13d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FA3R int:",9);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"R: ",3);
      poVar1 = Eigen::operator<<((ostream *)&std::cout,
                                 (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_1490);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"t: ",3);
      poVar1 = Eigen::operator<<((ostream *)&std::cout,
                                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_13e8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Eig:",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"R: ",3);
      poVar1 = Eigen::operator<<((ostream *)&std::cout,
                                 (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_14d8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"t: ",3);
      poVar1 = Eigen::operator<<((ostream *)&std::cout,
                                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_1400);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if (local_14f8.
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_14f8.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1518.
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1518.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::random_device::_M_fini();
      return 0;
    }
  }
  __assert_fail("other.rows() == 1 || other.cols() == 1",
                "/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x16e,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resizeLike(const EigenBase<OtherDerived> &) [Derived = Eigen::Matrix<double, 3, 1>, OtherDerived = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

int main()
{
	std::random_device rd;
	const int len = 1000;

	std::vector<Eigen::Vector3d> P, Q;
	for(int i = 0; i < len; ++i)
    {
	    auto P_ = randomMatrix(3, 1, &rd);
        auto Q_ = randomMatrix(3, 1, &rd);
        P.push_back(P_);
        Q.push_back(Q_);
    }

	Eigen::Matrix3d rRes_FA3Rd, rRes_FA3Ri, rRes_eig;
    Eigen::Vector3d tRes_FA3Rd, tRes_FA3Ri, tRes_eig;
    FA3R_double(&P, &Q, nullptr, 20, &rRes_FA3Rd, &tRes_FA3Rd);
    FA3R_int(&P, &Q, nullptr, 20, &rRes_FA3Ri, &tRes_FA3Ri);
    eig3D_eig(&P, &Q, nullptr, &rRes_eig, &tRes_eig);

    std::cout << "FA3R double:" << std::endl;
    std::cout << "R: " << rRes_FA3Rd << std::endl;
    std::cout << "t: " << tRes_FA3Rd << std::endl;
    std::cout << std::endl;
    std::cout << std::endl;

    std::cout << "FA3R int:" << std::endl;
    std::cout << "R: " << rRes_FA3Ri << std::endl;
    std::cout << "t: " << tRes_FA3Ri << std::endl;
    std::cout << std::endl;
    std::cout << std::endl;

    std::cout << "Eig:" << std::endl;
    std::cout << "R: " << rRes_eig << std::endl;
    std::cout << "t: " << tRes_eig << std::endl;

    return 0;
}